

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.h
# Opt level: O2

bool __thiscall
pbrt::TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF>::IsNonSpecular
          (TopOrBottomBxDF<pbrt::DielectricInterfaceBxDF,_pbrt::IdealDiffuseBxDF> *this)

{
  DielectricInterfaceBxDF *pDVar1;
  undefined1 auVar2 [16];
  BxDFFlags BVar3;
  
  pDVar1 = this->top;
  if (pDVar1 == (DielectricInterfaceBxDF *)0x0) {
    BVar3 = IdealDiffuseBxDF::Flags(this->bottom);
  }
  else {
    auVar2 = vminss_avx(ZEXT416((uint)(pDVar1->mfDistrib).alpha_y),
                        ZEXT416((uint)(pDVar1->mfDistrib).alpha_x));
    BVar3 = (uint)(auVar2._0_4_ < 0.001) * 8 + (GlossyTransmission|Reflection);
  }
  return (BVar3 & (Glossy|Diffuse)) != Unset;
}

Assistant:

PBRT_CPU_GPU
    bool IsNonSpecular() const {
        BxDFFlags flags = top ? top->Flags() : bottom->Flags();
        return (flags & (BxDFFlags::Diffuse | BxDFFlags::Glossy));
    }